

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

statement * make_statement(dmr_C *C,expression *expr)

{
  statement *stmt;
  expression *expr_local;
  dmr_C *C_local;
  
  if (expr == (expression *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else {
    C_local = (dmr_C *)dmrC_alloc_statement(C,expr->pos,2);
    (((anon_union_64_12_0e8c74c2_for_statement_2 *)&C_local->T)->field_1).expression = expr;
  }
  return (statement *)C_local;
}

Assistant:

static struct statement *make_statement(struct dmr_C *C, struct expression *expr)
{
	struct statement *stmt;

	if (!expr)
		return NULL;
	stmt = dmrC_alloc_statement(C, expr->pos, STMT_EXPRESSION);
	stmt->expression = expr;
	return stmt;
}